

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

void glfwMakeContextCurrent(GLFWwindow *handle)

{
  void *pvVar1;
  int code;
  
  pvVar1 = _glfwPlatformGetTls(&_glfw.contextSlot);
  if (_glfw.initialized == 0) {
    code = 0x10001;
  }
  else {
    if (handle == (GLFWwindow *)0x0) {
      if (pvVar1 != (void *)0x0) {
        (**(code **)((long)pvVar1 + 0x238))(0);
        return;
      }
      return;
    }
    if (*(int *)(handle + 0x1f0) != 0) {
      if ((pvVar1 != (void *)0x0) && (*(int *)(handle + 500) != *(int *)((long)pvVar1 + 500))) {
        (**(code **)((long)pvVar1 + 0x238))(0);
      }
      (**(code **)(handle + 0x238))(handle);
      return;
    }
    code = 0x1000a;
  }
  _glfwInputError(code,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwMakeContextCurrent(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFWwindow* previous = _glfwPlatformGetTls(&_glfw.contextSlot);

    _GLFW_REQUIRE_INIT();

    if (window && window->context.client == GLFW_NO_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
        return;
    }

    if (previous)
    {
        if (!window || window->context.source != previous->context.source)
            previous->context.makeCurrent(NULL);
    }

    if (window)
        window->context.makeCurrent(window);
}